

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O1

string * cppwinrt::file_to_string(string *__return_storage_ptr__,string *filename)

{
  ifstream file;
  stringstream asStack_398 [16];
  ostream local_388 [112];
  ios_base local_318 [264];
  undefined1 local_210 [16];
  streambuf local_200 [504];
  
  std::ifstream::ifstream(local_210,(string *)filename,_S_bin);
  std::__cxx11::stringstream::stringstream(asStack_398);
  std::ostream::operator<<(local_388,local_200);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_398);
  std::ios_base::~ios_base(local_318);
  std::ifstream::~ifstream(local_210);
  return __return_storage_ptr__;
}

Assistant:

inline std::string file_to_string(std::string const& filename)
    {
        std::ifstream file(filename, std::ios::binary);
        return static_cast<std::stringstream const&>(std::stringstream() << file.rdbuf()).str();
    }